

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int ecp_mul_comb(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P,
                _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  mbedtls_ecp_point *P_00;
  ulong uVar5;
  uint uVar6;
  mbedtls_ecp_point *pmVar7;
  byte bVar8;
  mbedtls_ecp_point *R_00;
  byte w;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  size_t t_len;
  bool bVar14;
  byte local_1cc;
  mbedtls_mpi M;
  mbedtls_mpi mm;
  uchar k [262];
  
  mbedtls_mpi_init(&M);
  mbedtls_mpi_init(&mm);
  iVar1 = mbedtls_mpi_get_bit(&grp->N,0);
  if (iVar1 != 1) {
    return -0x4f80;
  }
  uVar4 = grp->nbits;
  iVar1 = mbedtls_mpi_cmp_mpi(&P->Y,&(grp->G).Y);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_cmp_mpi(&P->X,&(grp->G).X);
    bVar14 = iVar1 == 0;
  }
  else {
    bVar14 = false;
  }
  bVar8 = (0x17f < uVar4 | 4U) + bVar14;
  w = 2;
  if ((ulong)bVar8 < grp->nbits) {
    w = bVar8;
  }
  uVar2 = 1 << (w - 1 & 0x1f);
  uVar5 = (ulong)w;
  uVar9 = (grp->nbits + uVar5) - 1;
  P_00 = (mbedtls_ecp_point *)0x0;
  uVar4 = uVar9 / uVar5;
  if (bVar14 != false) {
    P_00 = grp->T;
  }
  local_1cc = (byte)uVar2;
  if (P_00 == (mbedtls_ecp_point *)0x0) {
    P_00 = (mbedtls_ecp_point *)calloc((ulong)local_1cc,0x48);
    if (P_00 == (mbedtls_ecp_point *)0x0) {
      iVar1 = -0x4d80;
      P_00 = (mbedtls_ecp_point *)0x0;
      goto LAB_00158f11;
    }
    iVar1 = mbedtls_ecp_copy(P_00,P);
    if (iVar1 == 0) {
      uVar13 = 1;
      uVar6 = 0;
      do {
        pmVar7 = P_00 + uVar13;
        iVar1 = mbedtls_ecp_copy(pmVar7,P_00 + (uVar13 >> 1));
        if (iVar1 != 0) goto LAB_001591a3;
        uVar11 = uVar4;
        if (uVar5 <= uVar9) {
          do {
            iVar1 = ecp_double_jac(grp,pmVar7,pmVar7);
            if (iVar1 != 0) goto LAB_001591a3;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        uVar11 = (ulong)uVar6;
        bVar8 = (char)uVar6 + 1;
        uVar6 = (uint)bVar8;
        *(mbedtls_ecp_point **)(k + uVar11 * 8) = pmVar7;
        uVar12 = (int)uVar13 * 2 & 0xff;
        uVar13 = (ulong)uVar12;
      } while (uVar12 < uVar2);
      iVar1 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)k,(ulong)bVar8);
      if (iVar1 == 0) {
        uVar5 = 1;
        t_len = 0;
        do {
          uVar9 = uVar5 & 0xff;
          iVar3 = (int)uVar9;
          if ((char)uVar5 != '\0') {
            lVar10 = (ulong)(uint)(iVar3 * 8) * 9;
            pmVar7 = (mbedtls_ecp_point *)((long)&P_00[-1].X.s + lVar10);
            R_00 = (mbedtls_ecp_point *)((long)&P_00[-1].X.s + (ulong)(uint)(iVar3 * 0x90));
            uVar5 = t_len;
            do {
              iVar1 = ecp_add_mixed(grp,R_00,pmVar7,
                                    (mbedtls_ecp_point *)((long)&(P_00->X).s + lVar10));
              if (iVar1 != 0) goto LAB_001591a3;
              uVar9 = uVar9 - 1;
              t_len = (size_t)(byte)((char)uVar5 + 1);
              *(mbedtls_ecp_point **)(k + uVar5 * 8) = R_00;
              pmVar7 = pmVar7 + -1;
              R_00 = R_00 + -1;
              uVar5 = t_len;
            } while (uVar9 != 0);
          }
          uVar5 = (ulong)(uint)(iVar3 * 2);
        } while ((iVar3 * 2 & 0xffU) < uVar2);
        iVar1 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)k,t_len);
      }
    }
LAB_001591a3:
    if (iVar1 != 0) goto LAB_00158f11;
    if (bVar14 != false) {
      grp->T = P_00;
      grp->T_size = (ulong)local_1cc;
    }
  }
  iVar3 = mbedtls_mpi_get_bit(m,0);
  iVar1 = mbedtls_mpi_copy(&M,m);
  if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_sub_mpi(&mm,&grp->N,m), iVar1 == 0)) {
    iVar1 = mbedtls_mpi_safe_cond_assign(&M,&mm,iVar3 != 1);
    if (iVar1 == 0) {
      ecp_comb_fixed(k,uVar4,w,&M);
      iVar1 = ecp_mul_comb_core(grp,R,P_00,local_1cc,k,uVar4,f_rng,p_rng);
      if ((iVar1 == 0) && (iVar1 = ecp_safe_invert_jac(grp,R,iVar3 != 1), iVar1 == 0)) {
        iVar1 = ecp_normalize_jac(grp,R);
      }
    }
  }
LAB_00158f11:
  if ((bVar14 == false) && (P_00 != (mbedtls_ecp_point *)0x0)) {
    lVar10 = 0;
    do {
      mbedtls_ecp_point_free((mbedtls_ecp_point *)((long)&(P_00->X).s + lVar10));
      lVar10 = lVar10 + 0x48;
    } while ((ulong)((uVar2 & 0xff) + (uint)((uVar2 & 0xff) == 0)) * 0x48 != lVar10);
    free(P_00);
  }
  mbedtls_mpi_free(&M);
  mbedtls_mpi_free(&mm);
  if (iVar1 != 0) {
    mbedtls_ecp_point_free(R);
  }
  return iVar1;
}

Assistant:

static int ecp_mul_comb( mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                         const mbedtls_mpi *m, const mbedtls_ecp_point *P,
                         int (*f_rng)(void *, unsigned char *, size_t),
                         void *p_rng )
{
    int ret;
    unsigned char w, m_is_odd, p_eq_g, pre_len, i;
    size_t d;
    unsigned char k[COMB_MAX_D + 1];
    mbedtls_ecp_point *T;
    mbedtls_mpi M, mm;

    mbedtls_mpi_init( &M );
    mbedtls_mpi_init( &mm );

    /* we need N to be odd to trnaform m in an odd number, check now */
    if( mbedtls_mpi_get_bit( &grp->N, 0 ) != 1 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    /*
     * Minimize the number of multiplications, that is minimize
     * 10 * d * w + 18 * 2^(w-1) + 11 * d + 7 * w, with d = ceil( nbits / w )
     * (see costs of the various parts, with 1S = 1M)
     */
    w = grp->nbits >= 384 ? 5 : 4;

    /*
     * If P == G, pre-compute a bit more, since this may be re-used later.
     * Just adding one avoids upping the cost of the first mul too much,
     * and the memory cost too.
     */
#if MBEDTLS_ECP_FIXED_POINT_OPTIM == 1
    p_eq_g = ( mbedtls_mpi_cmp_mpi( &P->Y, &grp->G.Y ) == 0 &&
               mbedtls_mpi_cmp_mpi( &P->X, &grp->G.X ) == 0 );
    if( p_eq_g )
        w++;
#else
    p_eq_g = 0;
#endif

    /*
     * Make sure w is within bounds.
     * (The last test is useful only for very small curves in the test suite.)
     */
    if( w > MBEDTLS_ECP_WINDOW_SIZE )
        w = MBEDTLS_ECP_WINDOW_SIZE;
    if( w >= grp->nbits )
        w = 2;

    /* Other sizes that depend on w */
    pre_len = 1U << ( w - 1 );
    d = ( grp->nbits + w - 1 ) / w;

    /*
     * Prepare precomputed points: if P == G we want to
     * use grp->T if already initialized, or initialize it.
     */
    T = p_eq_g ? grp->T : NULL;

    if( T == NULL )
    {
        T = mbedtls_calloc( pre_len, sizeof( mbedtls_ecp_point ) );
        if( T == NULL )
        {
            ret = MBEDTLS_ERR_ECP_ALLOC_FAILED;
            goto cleanup;
        }

        MBEDTLS_MPI_CHK( ecp_precompute_comb( grp, T, P, w, d ) );

        if( p_eq_g )
        {
            grp->T = T;
            grp->T_size = pre_len;
        }
    }

    /*
     * Make sure M is odd (M = m or M = N - m, since N is odd)
     * using the fact that m * P = - (N - m) * P
     */
    m_is_odd = ( mbedtls_mpi_get_bit( m, 0 ) == 1 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &M, m ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &mm, &grp->N, m ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_safe_cond_assign( &M, &mm, ! m_is_odd ) );

    /*
     * Go for comb multiplication, R = M * P
     */
    ecp_comb_fixed( k, d, w, &M );
    MBEDTLS_MPI_CHK( ecp_mul_comb_core( grp, R, T, pre_len, k, d, f_rng, p_rng ) );

    /*
     * Now get m * P from M * P and normalize it
     */
    MBEDTLS_MPI_CHK( ecp_safe_invert_jac( grp, R, ! m_is_odd ) );
    MBEDTLS_MPI_CHK( ecp_normalize_jac( grp, R ) );

cleanup:

    if( T != NULL && ! p_eq_g )
    {
        for( i = 0; i < pre_len; i++ )
            mbedtls_ecp_point_free( &T[i] );
        mbedtls_free( T );
    }

    mbedtls_mpi_free( &M );
    mbedtls_mpi_free( &mm );

    if( ret != 0 )
        mbedtls_ecp_point_free( R );

    return( ret );
}